

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

Keyset * __thiscall GT7VolumeFile::getKeyset(GT7VolumeFile *this)

{
  int iVar1;
  allocator<char> local_29;
  string local_28 [32];
  
  if (getKeyset()::keyset == '\0') {
    iVar1 = __cxa_guard_acquire(&getKeyset()::keyset);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>(local_28,"KYZYLKUM-873068469",&local_29);
      std::__cxx11::string::string((string *)&getKeyset::keyset,local_28);
      getKeyset::keyset.m_key._M_elems[0] = _DAT_00163480;
      getKeyset::keyset.m_key._M_elems[1] = _UNK_00163484;
      getKeyset::keyset.m_key._M_elems[2] = _UNK_00163488;
      getKeyset::keyset.m_key._M_elems[3] = _UNK_0016348c;
      std::__cxx11::string::~string(local_28);
      __cxa_atexit(Keyset::~Keyset,&getKeyset::keyset,&__dso_handle);
      __cxa_guard_release(&getKeyset()::keyset);
    }
  }
  return &getKeyset::keyset;
}

Assistant:

const Keyset& GT7VolumeFile::getKeyset() const
{
	static const Keyset keyset({
		"KYZYLKUM-873068469", {{ 0xC9DA80A5, 0x050DA9A1, 0x9EB1FE65, 0xB651F2FB }}
	});
	return keyset;
}